

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatfoe.c
# Opt level: O2

int ecx_FOEread(ecx_contextt *context,uint16 slave,char *filename,uint32 password,int *psize,void *p
               ,int timeout)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint8 uVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  undefined6 in_register_00000032;
  uint uVar12;
  int iVar13;
  short local_854;
  ec_mbxbuft MbxOut;
  ec_mbxbuft MbxIn;
  
  iVar7 = *psize;
  ec_clearmbx(&MbxIn);
  ecx_mbxreceive(context,slave,&MbxIn,0);
  ec_clearmbx(&MbxOut);
  sVar6 = strlen(filename);
  uVar8 = CONCAT62(in_register_00000032,slave) & 0xffffffff;
  uVar11 = context->slavelist[uVar8].mbx_l - 0xc;
  uVar5 = (uint)sVar6;
  if ((uVar11 & 0xffff) < ((uint)sVar6 & 0xffff)) {
    uVar5 = uVar11;
  }
  MbxOut[2] = '\0';
  MbxOut[3] = '\0';
  MbxOut._0_2_ = (short)uVar5 + 6;
  MbxOut[4] = '\0';
  uVar3 = ec_nextmbxcnt(context->slavelist[uVar8].mbx_cnt);
  context->slavelist[uVar8].mbx_cnt = uVar3;
  MbxOut[5] = uVar3 << 4 | 4;
  MbxOut[6] = '\x01';
  MbxOut._8_4_ = password;
  memcpy(MbxOut + 0xc,filename,(ulong)(uVar5 & 0xffff));
  iVar4 = ecx_mbxsend(context,slave,&MbxOut,20000);
  if (0 < iVar4) {
    iVar9 = 0;
    iVar13 = 0;
    do {
      ec_clearmbx(&MbxIn);
      iVar4 = ecx_mbxreceive(context,slave,&MbxIn,timeout);
      uVar1 = MbxIn._8_4_;
      if (iVar4 < 1) {
        return iVar4;
      }
      if ((MbxIn[5] & 0xf) != 4) {
        iVar7 = -3;
        goto LAB_00109717;
      }
      if (MbxIn[6] != '\x03') {
        iVar7 = -3;
        if (MbxIn[6] == '\x05') {
          iVar7 = -5;
        }
        goto LAB_00109717;
      }
      if (MbxIn._8_4_ != iVar9 + 1) {
LAB_00109710:
        iVar7 = -6;
LAB_00109717:
        *psize = iVar13;
        return iVar7;
      }
      uVar5 = MbxIn._0_4_ - 6;
      uVar12 = uVar5 & 0xffff;
      iVar10 = iVar13 + uVar12;
      if (iVar7 < iVar10) goto LAB_00109710;
      memcpy(p,MbxIn + 0xc,(ulong)uVar12);
      local_854 = (short)uVar11;
      MbxOut[0] = '\x06';
      MbxOut[1] = '\0';
      MbxOut[2] = '\0';
      MbxOut[3] = '\0';
      MbxOut[4] = '\0';
      uVar3 = ec_nextmbxcnt(context->slavelist[uVar8].mbx_cnt);
      uVar2 = MbxIn._8_4_;
      context->slavelist[uVar8].mbx_cnt = uVar3;
      MbxOut[5] = uVar3 << 4 | 4;
      MbxOut[6] = '\x04';
      MbxIn[8] = (uint8)uVar1;
      MbxIn[9] = SUB41(uVar1,1);
      MbxIn[10] = SUB41(uVar1,2);
      MbxIn[0xb] = SUB41(uVar1,3);
      MbxOut[8] = MbxIn[8];
      MbxOut[9] = MbxIn[9];
      MbxOut[10] = MbxIn[10];
      MbxOut[0xb] = MbxIn[0xb];
      MbxIn._8_4_ = uVar2;
      iVar4 = ecx_mbxsend(context,slave,&MbxOut,20000);
      if (context->FOEhook != (_func_int_uint16_int_int *)0x0) {
        (*context->FOEhook)(slave,uVar1,iVar10);
      }
      p = (void *)((long)p + (ulong)uVar12);
      *psize = iVar10;
      iVar9 = uVar1;
      iVar13 = iVar10;
    } while (0 < iVar4 && (short)uVar5 == local_854);
  }
  return iVar4;
}

Assistant:

int ecx_FOEread(ecx_contextt *context, uint16 slave, char *filename, uint32 password, int *psize, void *p, int timeout)
{
   ec_FOEt *FOEp, *aFOEp;
   int wkc;
   int32 dataread = 0;
   int32 buffersize, packetnumber, prevpacket = 0;
   uint16 fnsize, maxdata, segmentdata;
   ec_mbxbuft MbxIn, MbxOut;
   uint8 cnt;
   boolean worktodo;

   buffersize = *psize;
   ec_clearmbx(&MbxIn);
   /* Empty slave out mailbox if something is in. Timout set to 0 */
   wkc = ecx_mbxreceive(context, slave, (ec_mbxbuft *)&MbxIn, 0);
   ec_clearmbx(&MbxOut);
   aFOEp = (ec_FOEt *)&MbxIn;
   FOEp = (ec_FOEt *)&MbxOut;
   fnsize = strlen(filename);
   maxdata = context->slavelist[slave].mbx_l - 12;
   if (fnsize > maxdata)
   {
      fnsize = maxdata;
   }
   FOEp->MbxHeader.length = htoes(0x0006 + fnsize);
   FOEp->MbxHeader.address = htoes(0x0000);
   FOEp->MbxHeader.priority = 0x00;
   /* get new mailbox count value, used as session handle */
   cnt = ec_nextmbxcnt(context->slavelist[slave].mbx_cnt);
   context->slavelist[slave].mbx_cnt = cnt;
   FOEp->MbxHeader.mbxtype = ECT_MBXT_FOE + (cnt << 4); /* FoE */
   FOEp->OpCode = ECT_FOE_READ;
   FOEp->Password = htoel(password);
   /* copy filename in mailbox */
   memcpy(&FOEp->FileName[0], filename, fnsize);
   /* send FoE request to slave */
   wkc = ecx_mbxsend(context, slave, (ec_mbxbuft *)&MbxOut, EC_TIMEOUTTXM);
   if (wkc > 0) /* succeeded to place mailbox in slave ? */
   {
      do
      {   
         worktodo = FALSE;
         /* clean mailboxbuffer */
         ec_clearmbx(&MbxIn);
         /* read slave response */
         wkc = ecx_mbxreceive(context, slave, (ec_mbxbuft *)&MbxIn, timeout);
         if (wkc > 0) /* succeeded to read slave response ? */
         {
            /* slave response should be FoE */
            if ((aFOEp->MbxHeader.mbxtype & 0x0f) == ECT_MBXT_FOE)
            {
               if(aFOEp->OpCode == ECT_FOE_DATA)
               {
                  segmentdata = etohs(aFOEp->MbxHeader.length) - 0x0006;
                  packetnumber = etohl(aFOEp->PacketNumber);
                  if ((packetnumber == ++prevpacket) && (dataread + segmentdata <= buffersize))
                  {
                     memcpy(p, &aFOEp->Data[0], segmentdata);
                     dataread += segmentdata;
                     p = (uint8 *)p + segmentdata;
                     if (segmentdata == maxdata)
                     {
                        worktodo = TRUE; 
                     }
                     FOEp->MbxHeader.length = htoes(0x0006);
                     FOEp->MbxHeader.address = htoes(0x0000);
                     FOEp->MbxHeader.priority = 0x00;
                     /* get new mailbox count value */
                     cnt = ec_nextmbxcnt(context->slavelist[slave].mbx_cnt);
                     context->slavelist[slave].mbx_cnt = cnt;
                     FOEp->MbxHeader.mbxtype = ECT_MBXT_FOE + (cnt << 4); /* FoE */
                     FOEp->OpCode = ECT_FOE_ACK;
                     FOEp->PacketNumber = htoel(packetnumber);
                     /* send FoE ack to slave */
                     wkc = ecx_mbxsend(context, slave, (ec_mbxbuft *)&MbxOut, EC_TIMEOUTTXM);
                     if (wkc <= 0)
                     {   
                        worktodo = FALSE;
                     }
                     if (context->FOEhook)
                     {
                        context->FOEhook(slave, packetnumber, dataread);
                     }
                  }
                  else
                  {
                     /* FoE error */
                     wkc = -EC_ERR_TYPE_FOE_BUF2SMALL;
                  }
               }
               else
               {
                  if(aFOEp->OpCode == ECT_FOE_ERROR)
                  {
                     /* FoE error */
                     wkc = -EC_ERR_TYPE_FOE_ERROR;
                  }
                  else
                  {
                     /* unexpected mailbox received */
                     wkc = -EC_ERR_TYPE_PACKET_ERROR;
                  }
               }
            }
            else
            {
               /* unexpected mailbox received */
               wkc = -EC_ERR_TYPE_PACKET_ERROR;
            }
            *psize = dataread;
         }
      } while (worktodo);   
   }
   
   return wkc;
}